

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O0

void icu_63::initNoopSingleton(UErrorCode *errorCode)

{
  UBool UVar1;
  NoopNormalizer2 *this;
  size_t in_RSI;
  NoopNormalizer2 *local_28;
  UErrorCode *errorCode_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    this = (NoopNormalizer2 *)UMemory::operator_new((UMemory *)0x8,in_RSI);
    local_28 = (NoopNormalizer2 *)0x0;
    if (this != (NoopNormalizer2 *)0x0) {
      NoopNormalizer2::NoopNormalizer2(this);
      local_28 = this;
    }
    noopSingleton = local_28;
    if (local_28 == (NoopNormalizer2 *)0x0) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      ucln_common_registerCleanup_63(UCLN_COMMON_NORMALIZER2,uprv_normalizer2_cleanup);
    }
  }
  return;
}

Assistant:

static void U_CALLCONV initNoopSingleton(UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return;
    }
    noopSingleton=new NoopNormalizer2;
    if(noopSingleton==NULL) {
        errorCode=U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    ucln_common_registerCleanup(UCLN_COMMON_NORMALIZER2, uprv_normalizer2_cleanup);
}